

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

void __thiscall
arangodb::velocypack::Validator::validateCompactArray(Validator *this,uint8_t *ptr,size_t length)

{
  ValueLength VVar1;
  ulong uVar2;
  Exception *this_00;
  char *msg;
  byte *pbVar3;
  byte *ptr_00;
  byte *local_40;
  byte *local_38;
  
  validateBufferLength(this,4,length,true);
  local_40 = ptr + 1;
  VVar1 = ReadVariableLengthValue<false>(&local_40,ptr + length + 1);
  ptr_00 = local_40;
  if ((VVar1 <= length) && (3 < VVar1)) {
    local_40 = ptr + (VVar1 - 1);
    VVar1 = ReadVariableLengthValue<true>(&local_40,ptr + VVar1);
    if (VVar1 != 0) {
      pbVar3 = local_40 + 1;
      local_40 = ptr_00;
      while (ptr_00 < pbVar3) {
        validatePart(this,ptr_00,(long)pbVar3 - (long)ptr_00,true);
        uVar2 = (ulong)"\x01\x01"[*ptr_00];
        local_38 = ptr_00;
        if (uVar2 == 0) {
          uVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&local_38,ptr_00);
        }
        VVar1 = VVar1 - 1;
        ptr_00 = ptr_00 + uVar2;
        if (VVar1 == 0) {
          return;
        }
      }
      local_40 = ptr_00;
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array items number is out of bounds";
      goto LAB_00114fa2;
    }
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  msg = "Array length value is out of bounds";
LAB_00114fa2:
  Exception::Exception(this_00,ValidatorInvalidLength,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateCompactArray(uint8_t const* ptr, std::size_t length) {
  // compact Array without index table
  validateBufferLength(4, length, true);

  uint8_t const* p = ptr + 1;
  // read byteLength
  ValueLength const byteSize = ReadVariableLengthValue<false>(p, p + length);
  if (byteSize > length || byteSize < 4) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length value is out of bounds");
  }

  // read nrItems
  uint8_t const* data = p;
  p = ptr + byteSize - 1;
  ValueLength nrItems = ReadVariableLengthValue<true>(p, ptr + byteSize);
  if (nrItems == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length value is out of bounds");
  }
  ++p;

  // validate the array members
  uint8_t const* e = p;
  p = data;
  while (nrItems-- > 0) {
    if (p >= e) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array items number is out of bounds");
    }
    validatePart(p, e - p, true);
    p += Slice(p).byteSize();
  }
}